

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestSuite::TestSuite
          (TestSuite *this,char *a_name,char *a_type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  SetUpTestSuiteFunc p_Var1;
  pointer local_a0;
  bool local_53;
  allocator local_52;
  undefined1 local_51;
  pointer local_50;
  allocator local_31;
  TearDownTestSuiteFunc local_30;
  TearDownTestSuiteFunc tear_down_tc_local;
  SetUpTestSuiteFunc set_up_tc_local;
  char *a_type_param_local;
  char *a_name_local;
  TestSuite *this_local;
  
  this->_vptr_TestSuite = (_func_int **)&PTR__TestSuite_00183ca8;
  local_30 = tear_down_tc;
  tear_down_tc_local = set_up_tc;
  set_up_tc_local = (SetUpTestSuiteFunc)a_type_param;
  a_type_param_local = a_name;
  a_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->name_,a_name,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_51 = 0;
  local_53 = set_up_tc_local == (SetUpTestSuiteFunc)0x0;
  if (local_53) {
    local_a0 = (pointer)0x0;
  }
  else {
    local_a0 = (pointer)operator_new(0x20);
    p_Var1 = set_up_tc_local;
    local_51 = 1;
    local_50 = local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a0,(char *)p_Var1,&local_52);
  }
  local_51 = 0;
  local_53 = !local_53;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>
              *)&this->type_param_,local_a0);
  if (local_53) {
    std::allocator<char>::~allocator((allocator<char> *)&local_52);
  }
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::vector
            (&this->test_info_list_);
  std::vector<int,_std::allocator<int>_>::vector(&this->test_indices_);
  this->set_up_tc_ = tear_down_tc_local;
  this->tear_down_tc_ = local_30;
  this->should_run_ = false;
  this->start_timestamp_ = 0;
  this->elapsed_time_ = 0;
  TestResult::TestResult(&this->ad_hoc_test_result_);
  return;
}

Assistant:

TestSuite::TestSuite(const char* a_name, const char* a_type_param,
                     internal::SetUpTestSuiteFunc set_up_tc,
                     internal::TearDownTestSuiteFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      start_timestamp_(0),
      elapsed_time_(0) {}